

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Cluster.c
# Opt level: O2

float ** Llb_ManComputeQuant(Llb_Mtr_t *p)

{
  uint uVar1;
  int iVar2;
  float **ppfVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  uint uVar7;
  long lVar8;
  long lVar9;
  bool bVar10;
  
  ppfVar3 = (float **)Extra_ArrayAlloc(p->nCols,p->nCols,4);
  uVar1 = p->nCols;
  uVar4 = 0;
  uVar5 = 0;
  if (0 < (int)uVar1) {
    uVar5 = (ulong)uVar1;
  }
  for (; uVar7 = uVar1, uVar4 != uVar5; uVar4 = uVar4 + 1) {
    while (bVar10 = uVar7 != 0, uVar7 = uVar7 - 1, bVar10) {
      ppfVar3[uVar4][uVar4] = 0.0;
    }
  }
  lVar6 = 2;
  for (lVar9 = 1; lVar8 = lVar6, lVar9 < (long)(int)uVar1 + -1; lVar9 = lVar9 + 1) {
    for (; (int)lVar8 < (int)((long)(int)uVar1 + -1); lVar8 = lVar8 + 1) {
      iVar2 = Llb_ManComputeCommonQuant(p,(int)lVar9,(int)lVar8);
      ppfVar3[lVar8][lVar9] = (float)iVar2;
      ppfVar3[lVar9][lVar8] = (float)iVar2;
    }
    lVar6 = lVar6 + 1;
  }
  return ppfVar3;
}

Assistant:

float ** Llb_ManComputeQuant( Llb_Mtr_t * p )
{
    float ** pCosts;
    int i, k;
    // alloc and clean
    pCosts = (float **)Extra_ArrayAlloc( p->nCols, p->nCols, sizeof(float) );
    for ( i = 0; i < p->nCols; i++ )
    for ( k = 0; k < p->nCols; k++ )
        pCosts[i][i] = 0.0;
    // fill up
    for ( i = 1; i < p->nCols-1; i++ )
    for ( k = i+1; k < p->nCols-1; k++ )
        pCosts[i][k] = pCosts[k][i] = Llb_ManComputeCommonQuant( p, i, k );
    return pCosts;
}